

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O2

tm * __thiscall fmt::v5::localtime(v5 *this,time_t *__timer)

{
  bool bVar1;
  format_error *this_00;
  dispatcher lt;
  
  lt.time_ = (time_t)__timer;
  bVar1 = localtime::dispatcher::run(&lt);
  if (bVar1) {
    *(char **)(this + 0x30) = lt.tm_.tm_zone;
    *(undefined8 *)(this + 0x20) = lt.tm_._32_8_;
    *(long *)(this + 0x28) = lt.tm_.tm_gmtoff;
    *(undefined8 *)(this + 0x10) = lt.tm_._16_8_;
    *(undefined8 *)(this + 0x18) = lt.tm_._24_8_;
    *(undefined8 *)this = lt.tm_._0_8_;
    *(undefined8 *)(this + 8) = lt.tm_._8_8_;
    return (tm *)this;
  }
  this_00 = (format_error *)__cxa_allocate_exception(0x10);
  format_error::format_error(this_00,"time_t value out of range");
  __cxa_throw(this_00,&format_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline std::tm localtime(std::time_t time) {
  struct dispatcher {
    std::time_t time_;
    std::tm tm_;

    dispatcher(std::time_t t): time_(t) {}

    bool run() {
      using namespace fmt::internal;
      return handle(localtime_r(&time_, &tm_));
    }

    bool handle(std::tm *tm) { return tm != FMT_NULL; }

    bool handle(internal::null<>) {
      using namespace fmt::internal;
      return fallback(localtime_s(&tm_, &time_));
    }

    bool fallback(int res) { return res == 0; }

    bool fallback(internal::null<>) {
      using namespace fmt::internal;
      std::tm *tm = std::localtime(&time_);
      if (tm) tm_ = *tm;
      return tm != FMT_NULL;
    }
  };
  dispatcher lt(time);
  if (lt.run())
    return lt.tm_;
  // Too big time values may be unsupported.
  FMT_THROW(format_error("time_t value out of range"));
}